

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O0

void udata_checkCommonData_63(UDataMemory *udm,UErrorCode *err)

{
  DataHeader *pDVar1;
  UBool UVar2;
  uint16_t uVar3;
  UErrorCode *err_local;
  UDataMemory *udm_local;
  
  UVar2 = U_FAILURE(*err);
  if (UVar2 == '\0') {
    if ((udm == (UDataMemory *)0x0) || (udm->pHeader == (DataHeader *)0x0)) {
      *err = U_INVALID_FORMAT_ERROR;
    }
    else if (((((udm->pHeader->dataHeader).magic1 == 0xda) &&
              ((udm->pHeader->dataHeader).magic2 == '\'')) &&
             ((udm->pHeader->info).isBigEndian == '\0')) &&
            ((udm->pHeader->info).charsetFamily == '\0')) {
      if ((((udm->pHeader->info).dataFormat[0] == 'C') &&
          ((udm->pHeader->info).dataFormat[1] == 'm')) &&
         (((udm->pHeader->info).dataFormat[2] == 'n' &&
          (((udm->pHeader->info).dataFormat[3] == 'D' &&
           ((udm->pHeader->info).formatVersion[0] == '\x01')))))) {
        udm->vFuncs = &CmnDFuncs;
        pDVar1 = udm->pHeader;
        uVar3 = udata_getHeaderSize_63(udm->pHeader);
        udm->toc = (pDVar1->info).dataFormat + (long)(int)(uint)uVar3 + -0xc;
      }
      else if (((udm->pHeader->info).dataFormat[0] == 'T') &&
              (((((udm->pHeader->info).dataFormat[1] == 'o' &&
                 ((udm->pHeader->info).dataFormat[2] == 'C')) &&
                ((udm->pHeader->info).dataFormat[3] == 'P')) &&
               ((udm->pHeader->info).formatVersion[0] == '\x01')))) {
        udm->vFuncs = &ToCPFuncs;
        pDVar1 = udm->pHeader;
        uVar3 = udata_getHeaderSize_63(udm->pHeader);
        udm->toc = (pDVar1->info).dataFormat + (long)(int)(uint)uVar3 + -0xc;
      }
      else {
        *err = U_INVALID_FORMAT_ERROR;
      }
    }
    else {
      *err = U_INVALID_FORMAT_ERROR;
    }
    UVar2 = U_FAILURE(*err);
    if (UVar2 != '\0') {
      udata_close_63(udm);
    }
  }
  return;
}

Assistant:

U_CFUNC void udata_checkCommonData(UDataMemory *udm, UErrorCode *err) {
    if (U_FAILURE(*err)) {
        return;
    }

    if(udm==NULL || udm->pHeader==NULL) {
      *err=U_INVALID_FORMAT_ERROR;
    } else if(!(udm->pHeader->dataHeader.magic1==0xda &&
        udm->pHeader->dataHeader.magic2==0x27 &&
        udm->pHeader->info.isBigEndian==U_IS_BIG_ENDIAN &&
        udm->pHeader->info.charsetFamily==U_CHARSET_FAMILY)
        ) {
        /* header not valid */
        *err=U_INVALID_FORMAT_ERROR;
    }
    else if (udm->pHeader->info.dataFormat[0]==0x43 &&
        udm->pHeader->info.dataFormat[1]==0x6d &&
        udm->pHeader->info.dataFormat[2]==0x6e &&
        udm->pHeader->info.dataFormat[3]==0x44 &&
        udm->pHeader->info.formatVersion[0]==1
        ) {
        /* dataFormat="CmnD" */
        udm->vFuncs = &CmnDFuncs;
        udm->toc=(const char *)udm->pHeader+udata_getHeaderSize(udm->pHeader);
    }
    else if(udm->pHeader->info.dataFormat[0]==0x54 &&
        udm->pHeader->info.dataFormat[1]==0x6f &&
        udm->pHeader->info.dataFormat[2]==0x43 &&
        udm->pHeader->info.dataFormat[3]==0x50 &&
        udm->pHeader->info.formatVersion[0]==1
        ) {
        /* dataFormat="ToCP" */
        udm->vFuncs = &ToCPFuncs;
        udm->toc=(const char *)udm->pHeader+udata_getHeaderSize(udm->pHeader);
    }
    else {
        /* dataFormat not recognized */
        *err=U_INVALID_FORMAT_ERROR;
    }

    if (U_FAILURE(*err)) {
        /* If the data is no good and we memory-mapped it ourselves,
         *  close the memory mapping so it doesn't leak.  Note that this has
         *  no effect on non-memory mapped data, other than clearing fields in udm.
         */
        udata_close(udm);
    }
}